

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O0

void __thiscall
validation_chainstatemanager_tests::chainstatemanager::test_method(chainstatemanager *this)

{
  __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
  right_end;
  __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
  right_end_00;
  bool bVar1;
  type pCVar2;
  Chainstate *pCVar3;
  CChain *pCVar4;
  Chainstate *pCVar5;
  uint256 *puVar6;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<CBlockIndex_*>,_bool> pVar7;
  CChain *active_chain2;
  Chainstate *c2;
  CChain *active_chain;
  Chainstate *c1;
  ChainstateManager *manager;
  CBlockIndex *active_tip2;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> all2;
  CBlockIndex *exp_tip;
  CBlockIndex *active_tip;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> all;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> chainstates;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  BlockValidationState _;
  uint256 snapshot_blockhash;
  char *in_stack_fffffffffffff0a8;
  char *in_stack_fffffffffffff0b0;
  char *in_stack_fffffffffffff0b8;
  char *pcVar8;
  ChainstateManager *in_stack_fffffffffffff0c8;
  char *this_00;
  const_string *in_stack_fffffffffffff0d0;
  undefined7 in_stack_fffffffffffff0d8;
  undefined1 in_stack_fffffffffffff0df;
  CBlockIndex *in_stack_fffffffffffff0e0;
  lazy_ostream *in_stack_fffffffffffff0e8;
  TestChain100Setup *in_stack_fffffffffffff0f0;
  undefined7 in_stack_fffffffffffff0f8;
  undefined1 in_stack_fffffffffffff0ff;
  undefined4 in_stack_fffffffffffff160;
  undefined4 in_stack_fffffffffffff164;
  equal_coll_impl *in_stack_fffffffffffff168;
  undefined7 in_stack_fffffffffffff1a0;
  undefined1 in_stack_fffffffffffff1a7;
  __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
  in_stack_fffffffffffff1a8;
  __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
  in_stack_fffffffffffff1b0;
  __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
  in_stack_fffffffffffff1b8;
  shared_ptr<const_CBlock> *in_stack_fffffffffffff270;
  undefined7 in_stack_fffffffffffff278;
  undefined1 in_stack_fffffffffffff27f;
  Chainstate *in_stack_fffffffffffff280;
  lazy_ostream local_b38;
  undefined1 local_b20 [64];
  lazy_ostream local_ae0;
  undefined1 local_ac8 [64];
  undefined1 local_a88 [16];
  undefined1 local_a78 [64];
  type local_a38;
  CBlockIndex *local_a30;
  undefined1 local_a24 [24];
  int local_a0c;
  undefined1 local_a08 [16];
  undefined1 local_9f8 [68];
  lazy_ostream local_9b4;
  int local_9a4;
  undefined1 local_9a0 [16];
  undefined1 local_990 [68];
  lazy_ostream local_94c;
  int local_93c;
  undefined1 local_938 [16];
  undefined1 local_928 [64];
  undefined1 local_8e8 [8];
  CChain *local_8e0;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [64];
  type local_888;
  const_string local_880;
  lazy_ostream local_870 [2];
  assertion_result local_848 [3];
  const_string local_7f8 [2];
  lazy_ostream local_7d8 [2];
  assertion_result local_7b8 [2];
  undefined1 local_780 [8];
  Chainstate *local_778;
  undefined1 local_770 [16];
  undefined1 local_760 [64];
  const_string local_720 [2];
  lazy_ostream local_700 [2];
  type local_6e0;
  assertion_result local_6d8 [2];
  const_string local_6a0 [2];
  lazy_ostream local_680 [2];
  assertion_result local_660 [2];
  undefined1 local_628 [16];
  undefined1 local_618 [64];
  const_string local_5d8 [2];
  lazy_ostream local_5b8 [3];
  assertion_result local_588 [2];
  CBlockIndex *local_550;
  Chainstate *local_548;
  type local_540;
  lazy_ostream *local_538;
  const_string local_530 [2];
  lazy_ostream local_510 [2];
  assertion_result local_4f0 [2];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [64];
  undefined1 local_468 [16];
  CBlockIndex *local_458;
  lazy_ostream local_44c;
  int local_43c;
  undefined1 local_438 [16];
  undefined1 local_428 [64];
  undefined1 local_3e8 [8];
  CChain *local_3e0;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [64];
  type local_388;
  const_string local_380;
  lazy_ostream local_370 [2];
  assertion_result local_348 [3];
  const_string local_2f8 [2];
  lazy_ostream local_2d8 [2];
  type local_2b8;
  assertion_result local_2b0 [2];
  const_string local_278 [2];
  lazy_ostream local_258 [2];
  assertion_result local_238 [2];
  Chainstate *local_200;
  const_string local_1f8 [2];
  lazy_ostream local_1d8 [2];
  assertion_result local_1b8 [3];
  _Base_ptr local_168;
  undefined1 local_160;
  lazy_ostream local_6a [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar2 = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator*
                     ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                      in_stack_fffffffffffff0b8);
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::vector
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff0a8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    ChainstateManager::SnapshotBlockhash(in_stack_fffffffffffff0c8);
    std::optional<uint256>::has_value((optional<uint256> *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff0b8,
               SUB81((ulong)in_stack_fffffffffffff0b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1b8,local_1d8,local_1f8,0x2d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  pCVar3 = ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_fffffffffffff0b8);
  local_200 = pCVar3;
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::push_back
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff0a8,
             (value_type *)0xccb57e);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    ChainstateManager::IsSnapshotActive(in_stack_fffffffffffff0c8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff0b8,
               SUB81((ulong)in_stack_fffffffffffff0b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_238,local_258,local_278,0x34,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff0a8);
    local_2b8 = pCVar2;
    test_method::anon_class_8_1_b523428d::operator()
              ((anon_class_8_1_b523428d *)in_stack_fffffffffffff0c8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff0b8,
               SUB81((ulong)in_stack_fffffffffffff0b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2b0,local_2d8,local_2f8,0x35,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ChainstateManager::GetAll
            ((ChainstateManager *)CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff0b0);
    std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff0b0);
    std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff0b0);
    std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff0b0);
    right_end._M_current._7_1_ = in_stack_fffffffffffff1a7;
    right_end._M_current._0_7_ = in_stack_fffffffffffff1a0;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_fffffffffffff168,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               in_stack_fffffffffffff1a8,right_end);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,(char (*) [1])in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    this_00 = "chainstates.end()";
    pcVar8 = "chainstates.begin()";
    in_stack_fffffffffffff0b8 = "all.end()";
    in_stack_fffffffffffff0b0 = "all.begin()";
    in_stack_fffffffffffff0a8 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_348,local_370,&local_380,0x37,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffff0a8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff0a8);
  local_388 = pCVar2;
  pCVar4 = test_method::anon_class_8_1_b523428d::operator()((anon_class_8_1_b523428d *)this_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,(char (*) [1])in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    local_3e8 = (undefined1  [8])&pCVar3->m_chain;
    in_stack_fffffffffffff0b8 = "&c1.m_chain";
    in_stack_fffffffffffff0b0 = local_3e8;
    in_stack_fffffffffffff0a8 = "&active_chain";
    local_3e0 = pCVar4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CChain*,CChain*>
              (local_3c8,local_3d8,0x3a,1,2,&local_3e0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  TestChain100Setup::mineBlocks
            (in_stack_fffffffffffff0f0,(int)((ulong)in_stack_fffffffffffff0e8 >> 0x20));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,(char (*) [1])in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffff0a8);
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff0a8);
    local_44c._4_8_ = pCVar2;
    local_43c = test_method::anon_class_8_1_b523428d::operator()((anon_class_8_1_b523428d *)this_00)
    ;
    local_44c._vptr_lazy_ostream._0_4_ = 0x6e;
    in_stack_fffffffffffff0b8 = "110";
    in_stack_fffffffffffff0b0 = (char *)&local_44c;
    in_stack_fffffffffffff0a8 =
         "(MaybeCheckNotHeld(manager.GetMutex()), [&]() -> decltype(auto) { UniqueLock criticalblock16(MaybeCheckNotHeld(manager.GetMutex()), \"manager.GetMutex()\", \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp\", 62); return manager.ActiveHeight(); }())"
    ;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_428,local_438,0x3e,1,2,&local_43c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffff0a8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff0a8);
  local_468._8_8_ = pCVar2;
  local_458 = test_method::anon_class_8_1_b523428d::operator()((anon_class_8_1_b523428d *)this_00);
  local_468._0_8_ = CChain::Tip((CChain *)in_stack_fffffffffffff0b8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,(char (*) [1])in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0b8 = "exp_tip";
    in_stack_fffffffffffff0b0 = local_468;
    in_stack_fffffffffffff0a8 = "active_tip";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CBlockIndex*,CBlockIndex*>
              (local_4a8,local_4b8,0x41,1,2,&local_458);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    ChainstateManager::SnapshotBlockhash((ChainstateManager *)this_00);
    std::optional<uint256>::has_value((optional<uint256> *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff0b8,
               SUB81((ulong)in_stack_fffffffffffff0b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4f0,local_510,local_530,0x43,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff0b8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff0a8);
  local_538 = local_6a;
  local_540 = pCVar2;
  pCVar5 = test_method::anon_class_16_2_2f8bdf0a::operator()
                     ((anon_class_16_2_2f8bdf0a *)in_stack_fffffffffffff0e8);
  local_548 = pCVar5;
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::push_back
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff0a8,
             (value_type *)0xccc159);
  fs::path::path((path *)0xccc17f,in_stack_fffffffffffff0a8);
  Chainstate::InitCoinsDB
            ((Chainstate *)in_stack_fffffffffffff0f0,(size_t)in_stack_fffffffffffff0e8,
             SUB81((ulong)in_stack_fffffffffffff0e0 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffff0e0 >> 0x30,0),
             (path *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
  fs::path::~path((path *)in_stack_fffffffffffff0a8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff0a8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff0e8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff0e0,
             (char *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
             (char *)in_stack_fffffffffffff0d0,(int)((ulong)this_00 >> 0x20),
             SUB81((ulong)this_00 >> 0x18,0));
  Chainstate::InitCoinsCache
            ((Chainstate *)in_stack_fffffffffffff0b8,(size_t)in_stack_fffffffffffff0b0);
  Chainstate::CoinsTip((Chainstate *)this_00);
  CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff0b8);
  CCoinsViewCache::SetBestBlock((CCoinsViewCache *)in_stack_fffffffffffff0a8,(uint256 *)0xccc24c);
  CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff0b8);
  local_550 = ::node::BlockManager::LookupBlockIndex((BlockManager *)this_00,(uint256 *)pcVar8);
  pVar7 = std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
          insert((set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                  *)in_stack_fffffffffffff0b8,(value_type *)in_stack_fffffffffffff0b0);
  local_168 = (_Base_ptr)pVar7.first._M_node;
  local_160 = pVar7.second;
  Chainstate::LoadChainTip
            ((Chainstate *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff0a8);
  BlockValidationState::BlockValidationState((BlockValidationState *)in_stack_fffffffffffff0a8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    std::shared_ptr<const_CBlock>::shared_ptr
              ((shared_ptr<const_CBlock> *)in_stack_fffffffffffff0a8,(nullptr_t)0xccc3b3);
    Chainstate::ActivateBestChain
              (in_stack_fffffffffffff280,
               (BlockValidationState *)CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278)
               ,in_stack_fffffffffffff270);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff0b8,
               SUB81((ulong)in_stack_fffffffffffff0b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_588,local_5b8,local_5d8,0x54,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    std::shared_ptr<const_CBlock>::~shared_ptr
              ((shared_ptr<const_CBlock> *)in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,(char (*) [1])in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    ChainstateManager::SnapshotBlockhash((ChainstateManager *)this_00);
    puVar6 = std::optional<uint256>::value((optional<uint256> *)in_stack_fffffffffffff0b8);
    in_stack_fffffffffffff0b8 = "snapshot_blockhash";
    in_stack_fffffffffffff0b0 = (char *)local_6a;
    in_stack_fffffffffffff0a8 = "manager.SnapshotBlockhash().value()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_618,local_628,0x56,1,2,puVar6);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    ChainstateManager::IsSnapshotActive((ChainstateManager *)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff0b8,
               SUB81((ulong)in_stack_fffffffffffff0b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_660,local_680,local_6a0,0x57,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff0a8);
    local_6e0 = pCVar2;
    test_method::anon_class_8_1_b523428d::operator()((anon_class_8_1_b523428d *)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff0b8,
               SUB81((ulong)in_stack_fffffffffffff0b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6d8,local_700,local_720,0x58,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,(char (*) [1])in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    local_778 = pCVar5;
    local_780 = (undefined1  [8])
                ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_fffffffffffff0b8);
    in_stack_fffffffffffff0b8 = "&manager.ActiveChainstate()";
    in_stack_fffffffffffff0b0 = local_780;
    in_stack_fffffffffffff0a8 = "&c2";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Chainstate*,Chainstate*>
              (local_760,local_770,0x59,1,2,&local_778);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_fffffffffffff0b8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff0b8,
               SUB81((ulong)in_stack_fffffffffffff0b0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0a8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7b8,local_7d8,local_7f8,0x5a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ChainstateManager::GetAll
            ((ChainstateManager *)CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff0b0);
    std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff0b0);
    std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff0b0);
    std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff0b0);
    right_end_00._M_current._7_1_ = in_stack_fffffffffffff1a7;
    right_end_00._M_current._0_7_ = in_stack_fffffffffffff1a0;
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (in_stack_fffffffffffff168,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
               in_stack_fffffffffffff1a8,right_end_00);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,(char (*) [1])in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    pcVar8 = "chainstates.end()";
    in_stack_fffffffffffff0b8 = "all2.end()";
    in_stack_fffffffffffff0b0 = "all2.begin()";
    in_stack_fffffffffffff0a8 = &DAT_00000004;
    boost::test_tools::tt_detail::report_assertion
              (local_848,local_870,&local_880,0x5c,CHECK,CHECK_EQUAL_COLL);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff0a8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffff0a8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff0a8);
  local_888 = pCVar2;
  pCVar4 = test_method::anon_class_8_1_b523428d::operator()((anon_class_8_1_b523428d *)pcVar8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,(char (*) [1])in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    local_8e8 = (undefined1  [8])&pCVar5->m_chain;
    in_stack_fffffffffffff0b8 = "&c2.m_chain";
    in_stack_fffffffffffff0b0 = local_8e8;
    in_stack_fffffffffffff0a8 = "&active_chain2";
    local_8e0 = pCVar4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CChain*,CChain*>
              (local_8c8,local_8d8,0x5f,1,2,&local_8e0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,(char (*) [1])in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffff0a8);
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff0a8);
    local_94c._4_8_ = pCVar2;
    local_93c = test_method::anon_class_8_1_b523428d::operator()((anon_class_8_1_b523428d *)pcVar8);
    local_94c._vptr_lazy_ostream._0_4_ = 0x6e;
    in_stack_fffffffffffff0b8 = "110";
    in_stack_fffffffffffff0b0 = (char *)&local_94c;
    in_stack_fffffffffffff0a8 =
         "(MaybeCheckNotHeld(manager.GetMutex()), [&]() -> decltype(auto) { UniqueLock criticalblock22(MaybeCheckNotHeld(manager.GetMutex()), \"manager.GetMutex()\", \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp\", 97); return manager.ActiveHeight(); }())"
    ;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_928,local_938,0x61,1,2,&local_93c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  TestChain100Setup::mineBlocks
            (in_stack_fffffffffffff0f0,(int)((ulong)in_stack_fffffffffffff0e8 >> 0x20));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,(char (*) [1])in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffff0a8);
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff0a8);
    local_9b4._4_8_ = pCVar2;
    local_9a4 = test_method::anon_class_8_1_b523428d::operator()((anon_class_8_1_b523428d *)pcVar8);
    local_9b4._vptr_lazy_ostream._0_4_ = 0x6f;
    in_stack_fffffffffffff0b8 = "111";
    in_stack_fffffffffffff0b0 = (char *)&local_9b4;
    in_stack_fffffffffffff0a8 =
         "(MaybeCheckNotHeld(manager.GetMutex()), [&]() -> decltype(auto) { UniqueLock criticalblock23(MaybeCheckNotHeld(manager.GetMutex()), \"manager.GetMutex()\", \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp\", 99); return manager.ActiveHeight(); }())"
    ;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_990,local_9a0,99,1,2,&local_9a4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,(char (*) [1])in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffff0a8);
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff0a8);
    local_a24._4_8_ = pCVar2;
    local_a24._12_8_ = pCVar3;
    local_a0c = test_method::anon_class_16_2_2f1816d8::operator()
                          ((anon_class_16_2_2f1816d8 *)pcVar8);
    local_a24._0_4_ = 0x6e;
    in_stack_fffffffffffff0b8 = "110";
    in_stack_fffffffffffff0b0 = local_a24;
    in_stack_fffffffffffff0a8 =
         "(MaybeCheckNotHeld(manager.GetMutex()), [&]() -> decltype(auto) { UniqueLock criticalblock24(MaybeCheckNotHeld(manager.GetMutex()), \"manager.GetMutex()\", \"/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp\", 100); return c1.m_chain.Height(); }())"
    ;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_9f8,local_a08,100,1,2,&local_a0c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffff0a8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff0a8);
  local_a38 = pCVar2;
  local_a30 = test_method::anon_class_8_1_b523428d::operator()((anon_class_8_1_b523428d *)pcVar8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,(char (*) [1])in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0b0 = (char *)&local_a30->pprev;
    in_stack_fffffffffffff0b8 = "active_tip2->pprev";
    in_stack_fffffffffffff0a8 = "active_tip";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CBlockIndex*,CBlockIndex*>
              (local_a78,local_a88,0x67,1,2,&local_458);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,(char (*) [1])in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    local_ae0._vptr_lazy_ostream = (_func_int **)CChain::Tip((CChain *)in_stack_fffffffffffff0b8);
    in_stack_fffffffffffff0b8 = "c1.m_chain.Tip()";
    in_stack_fffffffffffff0b0 = (char *)&local_ae0;
    in_stack_fffffffffffff0a8 = "active_tip";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CBlockIndex*,CBlockIndex*>
              (local_ac8,&local_ae0.m_empty,0x68,1,2,&local_458);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff0a8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0a8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff0e8,
               (const_string *)in_stack_fffffffffffff0e0,
               CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8),
               in_stack_fffffffffffff0d0);
    in_stack_fffffffffffff0e8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff0b0,(char (*) [1])in_stack_fffffffffffff0a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b0,
               (unsigned_long)in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0e0 = CChain::Tip((CChain *)in_stack_fffffffffffff0b8);
    in_stack_fffffffffffff0b8 = "c2.m_chain.Tip()";
    in_stack_fffffffffffff0b0 = (char *)&local_b38;
    in_stack_fffffffffffff0a8 = "active_tip2";
    local_b38._vptr_lazy_ostream = (_func_int **)in_stack_fffffffffffff0e0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,CBlockIndex*,CBlockIndex*>
              (local_b20,&local_b38.m_empty,0x69,1,2,&local_a30);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff0a8);
    in_stack_fffffffffffff0df = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff0df);
  std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::operator->
            ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
             in_stack_fffffffffffff0a8);
  ValidationSignals::SyncWithValidationInterfaceQueue
            ((ValidationSignals *)CONCAT17(in_stack_fffffffffffff0df,in_stack_fffffffffffff0d8));
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff0b8);
  BlockValidationState::~BlockValidationState((BlockValidationState *)in_stack_fffffffffffff0a8);
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff0b8);
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffff0b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstatemanager, TestChain100Setup)
{
    ChainstateManager& manager = *m_node.chainman;
    std::vector<Chainstate*> chainstates;

    BOOST_CHECK(!manager.SnapshotBlockhash().has_value());

    // Create a legacy (IBD) chainstate.
    //
    Chainstate& c1 = manager.ActiveChainstate();
    chainstates.push_back(&c1);

    BOOST_CHECK(!manager.IsSnapshotActive());
    BOOST_CHECK(WITH_LOCK(::cs_main, return !manager.IsSnapshotValidated()));
    auto all = manager.GetAll();
    BOOST_CHECK_EQUAL_COLLECTIONS(all.begin(), all.end(), chainstates.begin(), chainstates.end());

    auto& active_chain = WITH_LOCK(manager.GetMutex(), return manager.ActiveChain());
    BOOST_CHECK_EQUAL(&active_chain, &c1.m_chain);

    // Get to a valid assumeutxo tip (per chainparams);
    mineBlocks(10);
    BOOST_CHECK_EQUAL(WITH_LOCK(manager.GetMutex(), return manager.ActiveHeight()), 110);
    auto active_tip = WITH_LOCK(manager.GetMutex(), return manager.ActiveTip());
    auto exp_tip = c1.m_chain.Tip();
    BOOST_CHECK_EQUAL(active_tip, exp_tip);

    BOOST_CHECK(!manager.SnapshotBlockhash().has_value());

    // Create a snapshot-based chainstate.
    //
    const uint256 snapshot_blockhash = active_tip->GetBlockHash();
    Chainstate& c2 = WITH_LOCK(::cs_main, return manager.ActivateExistingSnapshot(snapshot_blockhash));
    chainstates.push_back(&c2);
    c2.InitCoinsDB(
        /*cache_size_bytes=*/1 << 23, /*in_memory=*/true, /*should_wipe=*/false);
    {
        LOCK(::cs_main);
        c2.InitCoinsCache(1 << 23);
        c2.CoinsTip().SetBestBlock(active_tip->GetBlockHash());
        c2.setBlockIndexCandidates.insert(manager.m_blockman.LookupBlockIndex(active_tip->GetBlockHash()));
        c2.LoadChainTip();
    }
    BlockValidationState _;
    BOOST_CHECK(c2.ActivateBestChain(_, nullptr));

    BOOST_CHECK_EQUAL(manager.SnapshotBlockhash().value(), snapshot_blockhash);
    BOOST_CHECK(manager.IsSnapshotActive());
    BOOST_CHECK(WITH_LOCK(::cs_main, return !manager.IsSnapshotValidated()));
    BOOST_CHECK_EQUAL(&c2, &manager.ActiveChainstate());
    BOOST_CHECK(&c1 != &manager.ActiveChainstate());
    auto all2 = manager.GetAll();
    BOOST_CHECK_EQUAL_COLLECTIONS(all2.begin(), all2.end(), chainstates.begin(), chainstates.end());

    auto& active_chain2 = WITH_LOCK(manager.GetMutex(), return manager.ActiveChain());
    BOOST_CHECK_EQUAL(&active_chain2, &c2.m_chain);

    BOOST_CHECK_EQUAL(WITH_LOCK(manager.GetMutex(), return manager.ActiveHeight()), 110);
    mineBlocks(1);
    BOOST_CHECK_EQUAL(WITH_LOCK(manager.GetMutex(), return manager.ActiveHeight()), 111);
    BOOST_CHECK_EQUAL(WITH_LOCK(manager.GetMutex(), return c1.m_chain.Height()), 110);

    auto active_tip2 = WITH_LOCK(manager.GetMutex(), return manager.ActiveTip());
    BOOST_CHECK_EQUAL(active_tip, active_tip2->pprev);
    BOOST_CHECK_EQUAL(active_tip, c1.m_chain.Tip());
    BOOST_CHECK_EQUAL(active_tip2, c2.m_chain.Tip());

    // Let scheduler events finish running to avoid accessing memory that is going to be unloaded
    m_node.validation_signals->SyncWithValidationInterfaceQueue();
}